

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relax_float_ops_pass.cpp
# Opt level: O1

bool __thiscall spvtools::opt::RelaxFloatOpsPass::IsRelaxed(RelaxFloatOpsPass *this,uint32_t r_id)

{
  IRContext *this_00;
  Instruction *this_01;
  uint32_t uVar1;
  uint uVar2;
  pointer ppIVar3;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> local_30;
  
  this_00 = (this->super_Pass).context_;
  if ((this_00->valid_analyses_ & kAnalysisDecorations) == kAnalysisNone) {
    IRContext::BuildDecorationManager(this_00);
  }
  analysis::DecorationManager::GetDecorationsFor
            (&local_30,
             (this_00->decoration_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::analysis::DecorationManager_*,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
             .super__Head_base<0UL,_spvtools::opt::analysis::DecorationManager_*,_false>.
             _M_head_impl,r_id,false);
  for (ppIVar3 = local_30.
                 super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppIVar3 !=
      local_30.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppIVar3 = ppIVar3 + 1) {
    this_01 = *ppIVar3;
    if (this_01->opcode_ == OpDecorate) {
      uVar2 = (this_01->has_result_id_ & 1) + 1;
      if (this_01->has_type_id_ == false) {
        uVar2 = (uint)this_01->has_result_id_;
      }
      uVar1 = Instruction::GetSingleWordOperand(this_01,uVar2 + 1);
      if (uVar1 == 0) break;
    }
  }
  if (local_30.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.
                    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_30.
                          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.
                          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return ppIVar3 !=
         local_30.
         super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
}

Assistant:

bool RelaxFloatOpsPass::IsRelaxed(uint32_t r_id) {
  for (auto r_inst : get_decoration_mgr()->GetDecorationsFor(r_id, false))
    if (r_inst->opcode() == spv::Op::OpDecorate &&
        spv::Decoration(r_inst->GetSingleWordInOperand(1)) ==
            spv::Decoration::RelaxedPrecision)
      return true;
  return false;
}